

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O3

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,uchar *add,size_t add_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = ctx->add_len;
  uVar4 = add_len + uVar3;
  iVar1 = -0x14;
  if (uVar4 >> 0x3d == 0 && uVar3 <= uVar4) {
    uVar2 = uVar3 & 0xf;
    if (uVar2 != 0) {
      uVar7 = 0x10 - uVar2;
      if (add_len <= 0x10 - uVar2) {
        uVar7 = add_len;
      }
      if (uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        uVar4 = 0;
        do {
          *(ulong *)(ctx->buf + uVar4 + uVar2 + 0x178 + -0x178) =
               *(ulong *)(ctx->buf + uVar4 + uVar2 + 0x178 + -0x178) ^ *(ulong *)(add + uVar4);
          uVar5 = uVar4 + 8;
          uVar6 = uVar4 + 0x10;
          uVar4 = uVar5;
        } while (uVar6 <= uVar7);
      }
      if (uVar5 < uVar7) {
        do {
          ctx->buf[uVar5 + uVar2 + 0x178 + -0x178] =
               ctx->buf[uVar5 + uVar2 + 0x178 + -0x178] ^ add[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
      }
      if (uVar2 + uVar7 == 0x10) {
        gcm_mult(ctx,ctx->buf,ctx->buf);
        uVar3 = ctx->add_len;
      }
      uVar4 = uVar3 + add_len;
      add_len = add_len - uVar7;
      add = add + uVar7;
    }
    ctx->add_len = uVar4;
    if (0xf < add_len) {
      do {
        *(ulong *)ctx->buf = *(ulong *)ctx->buf ^ *(ulong *)add;
        *(ulong *)(ctx->buf + 8) = *(ulong *)(ctx->buf + 8) ^ *(ulong *)((long)add + 8);
        gcm_mult(ctx,ctx->buf,ctx->buf);
        add_len = add_len - 0x10;
        add = (uchar *)((long)add + 0x10);
      } while (0xf < add_len);
    }
    iVar1 = 0;
    if (add_len != 0) {
      if (add_len < 8) {
        uVar4 = 0;
      }
      else {
        uVar3 = 0;
        do {
          *(ulong *)(ctx->buf + uVar3) =
               *(ulong *)(ctx->buf + uVar3) ^ *(ulong *)((long)add + uVar3);
          uVar4 = uVar3 + 8;
          uVar2 = uVar3 + 0x10;
          uVar3 = uVar4;
        } while (uVar2 <= add_len);
      }
      iVar1 = 0;
      if (uVar4 < add_len) {
        do {
          ctx->buf[uVar4] = ctx->buf[uVar4] ^ *(byte *)((long)add + uVar4);
          uVar4 = uVar4 + 1;
          iVar1 = 0;
        } while (add_len != uVar4);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,
                          const unsigned char *add, size_t add_len)
{
    const unsigned char *p;
    size_t use_len, offset;
    uint64_t new_add_len;

    /* AD is limited to 2^64 bits, ie 2^61 bytes
     * Also check for possible overflow */
#if SIZE_MAX > 0xFFFFFFFFFFFFFFFFULL
    if (add_len > 0xFFFFFFFFFFFFFFFFULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }
#endif
    new_add_len = ctx->add_len + (uint64_t) add_len;
    if (new_add_len < ctx->add_len || new_add_len >> 61 != 0) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    offset = ctx->add_len % 16;
    p = add;

    if (offset != 0) {
        use_len = 16 - offset;
        if (use_len > add_len) {
            use_len = add_len;
        }

        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, p, use_len);

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->add_len += use_len;
        add_len -= use_len;
        p += use_len;
    }

    ctx->add_len += add_len;

    while (add_len >= 16) {
        mbedtls_xor(ctx->buf, ctx->buf, p, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        add_len -= 16;
        p += 16;
    }

    if (add_len > 0) {
        mbedtls_xor(ctx->buf, ctx->buf, p, add_len);
    }

    return 0;
}